

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O3

bool duckdb::ExtensionHelper::TryAutoLoadExtension
               (DatabaseInstance *instance,string *extension_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  DBConfig *pDVar3;
  FileSystem *fs;
  DBConfigOptions *options;
  pointer *__ptr;
  string repository_url;
  ExtensionRepository autoinstall_repo;
  ExtensionInstallInfo *local_c8;
  string local_c0;
  ExtensionInstallOptions local_a0;
  ExtensionRepository local_70;
  
  bVar2 = DatabaseInstance::ExtensionIsLoaded(instance,extension_name);
  if (!bVar2) {
    pDVar3 = DBConfig::GetConfig(instance);
    fs = FileSystem::GetFileSystem(instance);
    if ((pDVar3->options).autoinstall_known_extensions == true) {
      GetAutoInstallExtensionsRepository_abi_cxx11_(&local_c0,(duckdb *)&pDVar3->options,options);
      ExtensionRepository::GetRepositoryByUrl(&local_70,&local_c0);
      paVar1 = &local_a0.version.field_2;
      local_a0.version._M_string_length = 0;
      local_a0.version.field_2._M_local_buf[0] = '\0';
      local_a0.force_install = false;
      local_a0.use_etags = false;
      local_a0.throw_on_origin_mismatch = false;
      local_a0.repository.ptr = &local_70;
      local_a0.version._M_dataplus._M_p = (pointer)paVar1;
      InstallExtension((ExtensionHelper *)&local_c8,instance,fs,extension_name,&local_a0);
      if (local_c8 != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&local_c8,local_c8);
      }
      local_c8 = (ExtensionInstallInfo *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.version._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.version._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.path._M_dataplus._M_p != &local_70.path.field_2) {
        operator_delete(local_70.path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    LoadExternalExtension(instance,fs,extension_name);
  }
  return true;
}

Assistant:

bool ExtensionHelper::TryAutoLoadExtension(DatabaseInstance &instance, const string &extension_name) noexcept {
	if (instance.ExtensionIsLoaded(extension_name)) {
		return true;
	}
	auto &dbconfig = DBConfig::GetConfig(instance);
	try {
		auto &fs = FileSystem::GetFileSystem(instance);
		if (dbconfig.options.autoinstall_known_extensions) {
			auto repository_url = GetAutoInstallExtensionsRepository(dbconfig.options);
			auto autoinstall_repo = ExtensionRepository::GetRepositoryByUrl(repository_url);
			ExtensionInstallOptions options;
			options.repository = autoinstall_repo;
			ExtensionHelper::InstallExtension(instance, fs, extension_name, options);
		}
		ExtensionHelper::LoadExternalExtension(instance, fs, extension_name);
		return true;
	} catch (...) {
		return false;
	}
}